

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall QRhiGles2::dispatch(QRhiGles2 *this,QRhiCommandBuffer *cb,int x,int y,int z)

{
  char **this_00;
  byte bVar1;
  Type bindingType;
  Span *pSVar2;
  long lVar3;
  long lVar4;
  Entry *pEVar5;
  int iVar6;
  Entry *pEVar7;
  Command *pCVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  QRhiResource *resource;
  int loadStoreTypeVal;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (cb[5].super_QRhiResource.m_objectName.d.size != 0) {
    this_00 = &cb[0x11].super_QRhiResource.m_objectName.d.ptr;
    local_48 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::begin
                                ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00);
    while( true ) {
      if (local_48.d == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
          local_48.bucket == 0) break;
      pSVar2 = (local_48.d)->spans;
      uVar10 = local_48.bucket >> 7;
      pEVar7 = pSVar2[uVar10].entries;
      bVar1 = pSVar2[uVar10].offsets[(uint)local_48.bucket & 0x7f];
      pEVar5 = pEVar7 + bVar1;
      (pEVar5->storage).data[8] = '\0';
      (pEVar5->storage).data[9] = '\0';
      (pEVar5->storage).data[10] = '\0';
      (pEVar5->storage).data[0xb] = '\0';
      pEVar7[bVar1].storage.data[0xc] = '\0';
      QHashPrivate::iterator<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::operator++
                (&local_48);
    }
    lVar3 = cb[5].super_QRhiResource.m_objectName.d.size;
    uVar11 = *(uint *)(lVar3 + 0x38);
    uVar12 = 0;
    uVar10 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar10 = uVar12;
    }
    for (; uVar10 * 0x118 - uVar12 != 0; uVar12 = uVar12 + 0x118) {
      lVar4 = *(long *)(lVar3 + 0x40);
      bindingType = *(Type *)(lVar4 + 8 + uVar12);
      if (bindingType - BufferLoad < 3) {
        resource = *(QRhiResource **)(lVar4 + 0x10 + uVar12);
        iVar9 = 7;
        iVar6 = 8;
        loadStoreTypeVal = 9;
LAB_004e4cb6:
        qrhigl_accumulateComputeResource<QHash<QRhiResource*,std::pair<int,bool>>>
                  ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00,resource,bindingType,
                   iVar9,iVar6,loadStoreTypeVal);
      }
      else if (bindingType - ImageLoad < 3) {
        resource = *(QRhiResource **)(lVar4 + 0x10 + uVar12);
        iVar9 = 4;
        iVar6 = 5;
        loadStoreTypeVal = 6;
        goto LAB_004e4cb6;
      }
    }
    local_48 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::begin
                                ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00);
    uVar11 = 0;
LAB_004e4ce5:
    do {
      if (local_48.d == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
          local_48.bucket == 0) goto LAB_004e4d80;
      pSVar2 = (local_48.d)->spans;
      uVar10 = local_48.bucket >> 7;
      pEVar7 = pSVar2[uVar10].entries;
      bVar1 = pSVar2[uVar10].offsets[(uint)local_48.bucket & 0x7f];
      iVar9 = *(int *)(pEVar7[bVar1].storage.data + 8);
      if (iVar9 != 0) {
        pEVar7 = pEVar7 + bVar1;
        if ((pEVar7->storage).data[0xc] == '\0') {
          iVar6 = (**(code **)(**(long **)(pEVar7->storage).data + 0x10))();
          if (iVar6 == 1) {
            uVar11 = uVar11 | 0x20;
          }
          else {
            uVar11 = uVar11 | 0x2000;
          }
        }
        if (iVar9 == 1) {
          local_48 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::erase
                                      ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)this_00,
                                       (const_iterator)local_48);
          goto LAB_004e4ce5;
        }
      }
      QHashPrivate::iterator<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::operator++
                (&local_48);
    } while( true );
  }
LAB_004e4d9f:
  pCVar8 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                     ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)(cb + 1));
  pCVar8->cmd = Dispatch;
  (pCVar8->args).scissor.x = x;
  (pCVar8->args).scissor.y = y;
  (pCVar8->args).scissor.w = z;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_004e4d80:
  if (uVar11 != 0) {
    pCVar8 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                       ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)(cb + 1));
    pCVar8->cmd = Barrier;
    (pCVar8->args).stencilRef.ref = uVar11;
  }
  goto LAB_004e4d9f;
}

Assistant:

void QRhiGles2::dispatch(QRhiCommandBuffer *cb, int x, int y, int z)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::ComputePass);

    if (cbD->currentComputeSrb) {
        GLbitfield barriers = 0;

        // The key in the writtenResources map indicates that the resource was
        // written in a previous dispatch, whereas the value accumulates the
        // access mask in the current one.
        for (auto &accessAndIsNewFlag : cbD->computePassState.writtenResources)
            accessAndIsNewFlag = { 0, false };

        QGles2ShaderResourceBindings *srbD = QRHI_RES(QGles2ShaderResourceBindings, cbD->currentComputeSrb);
        const int bindingCount = srbD->m_bindings.size();
        for (int i = 0; i < bindingCount; ++i) {
            const QRhiShaderResourceBinding::Data *b = shaderResourceBindingData(srbD->m_bindings.at(i));
            switch (b->type) {
            case QRhiShaderResourceBinding::ImageLoad:
            case QRhiShaderResourceBinding::ImageStore:
            case QRhiShaderResourceBinding::ImageLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.simage.tex,
                                                 b->type,
                                                 QRhiShaderResourceBinding::ImageLoad,
                                                 QRhiShaderResourceBinding::ImageStore,
                                                 QRhiShaderResourceBinding::ImageLoadStore);
                break;
            case QRhiShaderResourceBinding::BufferLoad:
            case QRhiShaderResourceBinding::BufferStore:
            case QRhiShaderResourceBinding::BufferLoadStore:
                qrhigl_accumulateComputeResource(&cbD->computePassState.writtenResources,
                                                 b->u.sbuf.buf,
                                                 b->type,
                                                 QRhiShaderResourceBinding::BufferLoad,
                                                 QRhiShaderResourceBinding::BufferStore,
                                                 QRhiShaderResourceBinding::BufferLoadStore);
                break;
            default:
                break;
            }
        }

        for (auto it = cbD->computePassState.writtenResources.begin(); it != cbD->computePassState.writtenResources.end(); ) {
            const int accessInThisDispatch = it->first;
            const bool isNewInThisDispatch = it->second;
            if (accessInThisDispatch && !isNewInThisDispatch) {
                if (it.key()->resourceType() == QRhiResource::Texture)
                    barriers |= GL_SHADER_IMAGE_ACCESS_BARRIER_BIT;
                else
                    barriers |= GL_SHADER_STORAGE_BARRIER_BIT;
            }
            // Anything that was previously written, but is only read now, can be
            // removed from the written list (because that previous write got a
            // corresponding barrier now).
            if (accessInThisDispatch == QGles2CommandBuffer::ComputePassState::Read)
                it = cbD->computePassState.writtenResources.erase(it);
            else
                ++it;
        }

        if (barriers) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::Barrier;
            cmd.args.barrier.barriers = barriers;
        }
    }

    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
    cmd.cmd = QGles2CommandBuffer::Command::Dispatch;
    cmd.args.dispatch.x = GLuint(x);
    cmd.args.dispatch.y = GLuint(y);
    cmd.args.dispatch.z = GLuint(z);
}